

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_version_details.c
# Opt level: O0

void archive_regex_version(archive_string *str)

{
  archive_string *str_local;
  
  return;
}

Assistant:

static void
archive_regex_version(struct archive_string* str)
{
#if HAVE_LIBPCREPOSIX && HAVE_PCRE_H
	archive_strcat(str, " libpcre/");
	archive_strcat(str, archive_libpcre_version());
#elif HAVE_LIBPCRE2POSIX && HAVE_PCRE2_H
	archive_strcat(str, " libpcre2/");
	archive_strcat(str, archive_libpcre2_version());
#else
	(void)str; /* UNUSED */
#endif
}